

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBrokerData.cpp
# Opt level: O2

shared_ptr<helics::helicsCLI11App> __thiscall
helics::NetworkBrokerData::commandLineParser
          (NetworkBrokerData *this,string_view localAddress,bool enableConfig)

{
  HelicsConfigJSON *pHVar1;
  Option *pOVar2;
  Option *pOVar3;
  App *pAVar4;
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *variable;
  int in_R8D;
  long lVar5;
  shared_ptr<helics::helicsCLI11App> sVar6;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values_01;
  allocator<char> local_c14;
  allocator<char> local_c13;
  allocator<char> local_c12;
  allocator<char> local_c11;
  _Any_data local_c10;
  code *local_c00;
  code *local_bf8;
  char *local_bf0;
  undefined8 local_be8;
  Validator local_be0;
  string local_b78;
  _Any_data local_b58;
  code *local_b48;
  code *pcStack_b40;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ad8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a58;
  _Any_data local_a18;
  code *local_a08;
  code *local_a00;
  string local_9f8;
  string local_9d8;
  string local_9b8;
  string local_998;
  string local_978;
  string local_958;
  string local_938;
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  _Any_data local_378;
  code *local_368;
  code *local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  Validator local_238;
  Validator local_1d0;
  Validator local_168;
  Validator local_100;
  Validator local_98;
  
  local_be8 = CONCAT71(in_register_00000009,enableConfig);
  local_bf0 = localAddress._M_str;
  variable = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             localAddress._M_len;
  std::make_shared<helics::helicsCLI11App,char_const(&)[94]>((char (*) [94])this);
  if (in_R8D != 0) {
    pHVar1 = addJsonConfig((App *)(this->brokerName)._M_dataplus._M_p);
    (pHVar1->super_ConfigBase).maximumLayers = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"helics",(allocator<char> *)local_b58._M_pod_data);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &pHVar1->mPromoteSection,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
  }
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  (pAVar4->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_case_ = true;
  (pAVar4->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_underscore_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_398,"--local{0},--ipv4{4},--ipv6{6},--all{10},--external{10}",
             (allocator<char> *)local_b58._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"specify external interface to use, default is --local",
             (allocator<char> *)&local_be0);
  pOVar2 = CLI::App::add_flag<gmlc::networking::InterfaceNetworks,_(CLI::detail::enabler)0>
                     (pAVar4,&local_398,
                      (InterfaceNetworks *)(variable[5].field_2._M_local_buf + 0xc),&local_3b8);
  (pOVar2->super_OptionBase<CLI::Option>).disable_flag_override_ = true;
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_398);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,"--network_connectivity",(allocator<char> *)&local_b78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,"specify the connectivity of the network interface",&local_c13);
  pOVar3 = CLI::App::
           add_option<gmlc::networking::InterfaceNetworks,_gmlc::networking::InterfaceNetworks,_(CLI::detail::enabler)0>
                     (pAVar4,&local_3d8,
                      (InterfaceNetworks *)(variable[5].field_2._M_local_buf + 0xc),&local_3f8);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[2],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_b58,(char (*) [6])0x393412,(char (*) [2])0x3a2426);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[2],_true>
            (&local_b18,(char (*) [5])"ipv4",(char (*) [2])0x39c0c8);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[2],_true>
            (&local_ad8,(char (*) [5])"ipv6",(char (*) [2])0x3a5a69);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[9],_const_char_(&)[3],_true>
            (&local_a98,(char (*) [9])"external",(char (*) [3])0x39c449);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[3],_true>
            (&local_a58,(char (*) [4])0x397b53,(char (*) [3])0x39c449);
  values._M_len = 5;
  values._M_array = (iterator)&local_b58;
  CLI::CheckedTransformer::CheckedTransformer<>((CheckedTransformer *)&local_be0,values);
  CLI::Validator::Validator(&local_98,&local_be0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c10._M_pod_data,"",&local_c14);
  pOVar3 = CLI::Option::transform(pOVar3,&local_98,(string *)&local_c10);
  CLI::Option::excludes(pOVar3,pOVar2);
  std::__cxx11::string::~string((string *)local_c10._M_pod_data);
  CLI::Validator::~Validator(&local_98);
  CLI::Validator::~Validator(&local_be0);
  lVar5 = 0x100;
  do {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&local_b58 + lVar5));
    lVar5 = lVar5 + -0x40;
  } while (lVar5 != -0x40);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_3d8);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,"--broker_address",(allocator<char> *)&local_be0);
  local_b48 = (code *)0x0;
  pcStack_b40 = (code *)0x0;
  local_b58._M_unused._M_object = (void *)0x0;
  local_b58._8_8_ = 0;
  local_b58._M_unused._M_object = operator_new(0x18);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_b58._M_unused._0_8_ =
       variable;
  *(char **)((long)local_b58._M_unused._0_8_ + 8) = local_bf0;
  *(undefined8 *)((long)local_b58._M_unused._0_8_ + 0x10) = local_be8;
  pcStack_b40 = CLI::std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:48:13)>
                ::_M_invoke;
  local_b48 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:48:13)>
              ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"location of the broker i.e. network address",
             (allocator<char> *)local_c10._M_pod_data);
  pOVar2 = CLI::App::add_option_function<std::__cxx11::string>
                     (pAVar4,&local_418,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&local_b58,&local_438);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"HELICS_BROKER_ADDRESS",(allocator<char> *)&local_b78);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pOVar2->envname_,
             &local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_438);
  std::_Function_base::~_Function_base((_Function_base *)&local_b58);
  std::__cxx11::string::~string((string *)&local_418);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,"--reuse_address",(allocator<char> *)local_b58._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,
             "allow the server to reuse a bound address, mostly useful for tcp cores",
             (allocator<char> *)&local_be0);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_458,(bool *)(variable[5].field_2._M_local_buf + 0xd),&local_478);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_458);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"--noackconnect",(allocator<char> *)local_b58._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b8,
             "specify that a connection_ack message is not required to be connected with a broker",
             (allocator<char> *)&local_be0);
  pOVar2 = CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
                     (pAVar4,&local_498,(bool *)((long)&variable[6]._M_dataplus._M_p + 1),&local_4b8
                     );
  CLI::Option::ignore_underscore<CLI::App>(pOVar2,true);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_498);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,"--force",(allocator<char> *)local_b58._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f8,
             "if set to true the broker will on an unsuccessful connection as root broker attempt to terminate any existing brokers and reconnect"
             ,(allocator<char> *)&local_be0);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_4d8,(bool *)((long)&variable[6]._M_dataplus._M_p + 6),&local_4f8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_4d8);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"--broker",(allocator<char> *)&local_be0);
  local_b48 = (code *)0x0;
  pcStack_b40 = (code *)0x0;
  local_b58._M_unused._M_object = (void *)0x0;
  local_b58._8_8_ = 0;
  local_b58._M_unused._M_object = operator_new(0x18);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_b58._M_unused._0_8_ =
       variable;
  *(char **)((long)local_b58._M_unused._0_8_ + 8) = local_bf0;
  *(undefined8 *)((long)local_b58._M_unused._0_8_ + 0x10) = local_be8;
  pcStack_b40 = CLI::std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:72:9)>
                ::_M_invoke;
  local_b48 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:72:9)>
              ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,
             "identifier for the broker, this is either the name or network address use --broker_address or --brokername to explicitly set the network address or name the search for the broker is first by name"
             ,(allocator<char> *)local_c10._M_pod_data);
  CLI::App::add_option_function<std::__cxx11::string>
            (pAVar4,&local_518,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_b58,&local_538);
  std::__cxx11::string::~string((string *)&local_538);
  std::_Function_base::~_Function_base((_Function_base *)&local_b58);
  std::__cxx11::string::~string((string *)&local_518);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"--brokername",(allocator<char> *)local_b58._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_578,"the name of the broker",(allocator<char> *)&local_be0);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_558,variable,&local_578);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_558);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_598,"--maxsize",(allocator<char> *)&local_be0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"The message buffer size",(allocator<char> *)local_c10._M_pod_data
            );
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar4,&local_598,(int *)variable[5].field_2._M_local_buf,&local_5b8);
  pOVar2 = CLI::Option::capture_default_str(pOVar2);
  CLI::Validator::Validator(&local_100,(Validator *)CLI::PositiveNumber);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b58._M_pod_data,"",(allocator<char> *)&local_b78);
  CLI::Option::check(pOVar2,&local_100,(string *)&local_b58);
  std::__cxx11::string::~string((string *)local_b58._M_pod_data);
  CLI::Validator::~Validator(&local_100);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::__cxx11::string::~string((string *)&local_598);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d8,"--maxcount",(allocator<char> *)&local_be0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,"The maximum number of message to have in a queue",
             (allocator<char> *)local_c10._M_pod_data);
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar4,&local_5d8,(int *)(variable[5].field_2._M_local_buf + 4),&local_5f8);
  pOVar2 = CLI::Option::capture_default_str(pOVar2);
  CLI::Validator::Validator(&local_168,(Validator *)CLI::PositiveNumber);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b58._M_pod_data,"",(allocator<char> *)&local_b78);
  CLI::Option::check(pOVar2,&local_168,(string *)&local_b58);
  std::__cxx11::string::~string((string *)local_b58._M_pod_data);
  CLI::Validator::~Validator(&local_168);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::__cxx11::string::~string((string *)&local_5d8);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_618,"--networkretries",(allocator<char> *)local_b58._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_638,"the maximum number of network retries",
             (allocator<char> *)&local_be0);
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar4,&local_618,(int *)(variable[5].field_2._M_local_buf + 8),&local_638);
  CLI::Option::capture_default_str(pOVar2);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_618);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_658,"--useosport",(allocator<char> *)local_b58._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_678,
             "specify that the ports should be allocated by the host operating system",
             (allocator<char> *)&local_be0);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_658,(bool *)(variable[5].field_2._M_local_buf + 0xe),&local_678);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&local_658);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_698,"--autobroker",(allocator<char> *)local_b58._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b8,
             "allow a broker to be automatically created if one is not available",
             (allocator<char> *)&local_be0);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_698,(bool *)(variable[5].field_2._M_local_buf + 0xf),&local_6b8);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_698);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d8,"--brokerinitstring",(allocator<char> *)local_b58._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f8,"the initialization string for the broker",
             (allocator<char> *)&local_be0);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_6d8,variable + 3,&local_6f8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string((string *)&local_6d8);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_718,"--brokerinit",(allocator<char> *)local_b58._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_738,"the initialization string for the broker",
             (allocator<char> *)&local_be0);
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_718,variable + 3,&local_738);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"HELICS_BROKER_INIT",(allocator<char> *)local_c10._M_pod_data);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pOVar2->envname_,
             &local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_718);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_758,"--client{0},--server{1}",(allocator<char> *)local_b58._M_pod_data
            );
  local_a18._8_8_ = 0;
  local_a00 = CLI::std::
              _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:116:13)>
              ::_M_invoke;
  local_a08 = CLI::std::
              _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:116:13)>
              ::_M_manager;
  local_a18._M_unused._0_8_ = (undefined8)variable;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_778,"specify that the network connection should be a server or client"
             ,(allocator<char> *)&local_be0);
  pOVar2 = CLI::App::add_flag_function
                     (pAVar4,&local_758,(function<void_(long)> *)&local_a18,&local_778);
  (pOVar2->super_OptionBase<CLI::Option>).disable_flag_override_ = true;
  std::__cxx11::string::~string((string *)&local_778);
  std::_Function_base::~_Function_base((_Function_base *)&local_a18);
  std::__cxx11::string::~string((string *)&local_758);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_798,"--local_interface",(allocator<char> *)&local_be0);
  local_b58._8_8_ = 0;
  pcStack_b40 = CLI::std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:132:9)>
                ::_M_invoke;
  local_b48 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:132:9)>
              ::_M_manager;
  local_b58._M_unused._0_8_ = (undefined8)variable;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b8,"the local interface to use for the receive ports",
             (allocator<char> *)local_c10._M_pod_data);
  CLI::App::add_option_function<std::__cxx11::string>
            (pAVar4,&local_798,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_b58,&local_7b8);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_b58);
  std::__cxx11::string::~string((string *)&local_798);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,"--port,-p",(allocator<char> *)&local_b78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f8,"port number to use",&local_c13);
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar4,&local_7d8,(int *)(variable + 5),&local_7f8);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[3],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_be0,(char (*) [5])0x3880a1,(char (*) [3])0x3a599f);
  values_00._M_len = 1;
  values_00._M_array = (iterator)&local_be0;
  CLI::Transformer::Transformer<std::__cxx11::string(&)(std::__cxx11::string)>
            ((Transformer *)&local_b58,values_00,CLI::ignore_case);
  CLI::Validator::Validator(&local_1d0,(Validator *)&local_b58);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c10._M_pod_data,"",&local_c14);
  CLI::Option::transform(pOVar2,&local_1d0,(string *)&local_c10);
  std::__cxx11::string::~string((string *)local_c10._M_pod_data);
  CLI::Validator::~Validator(&local_1d0);
  CLI::Validator::~Validator((Validator *)&local_b58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_be0);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::__cxx11::string::~string((string *)&local_7d8);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_818,"--brokerport",(allocator<char> *)local_b58._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_838,"the port number to use to connect with the broker",
             (allocator<char> *)&local_be0);
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar4,&local_818,(int *)((long)&variable[5]._M_dataplus._M_p + 4),&local_838)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"HELICS_BROKER_PORT",(allocator<char> *)local_c10._M_pod_data);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pOVar2->envname_,
             &local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_838);
  std::__cxx11::string::~string((string *)&local_818);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_858,"--connectionport",(allocator<char> *)local_b58._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_878,"the port number to use to connect a co-simulation",
             (allocator<char> *)&local_be0);
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar4,&local_858,(int *)&variable[5]._M_string_length,&local_878);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"HELICS_CONNECTION_PORT",(allocator<char> *)local_c10._M_pod_data)
  ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pOVar2->envname_,
             &local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_878);
  std::__cxx11::string::~string((string *)&local_858);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_898,"--connectionaddress",(allocator<char> *)local_b58._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b8,"the network address to use to connect a co-simulation",
             (allocator<char> *)&local_be0);
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_898,variable + 4,&local_8b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,"HELICS_CONNECTION_ADDRESS",
             (allocator<char> *)local_c10._M_pod_data);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pOVar2->envname_,
             &local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::__cxx11::string::~string((string *)&local_898);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,"--localport",&local_c13);
  local_c10._8_8_ = 0;
  local_bf8 = CLI::std::
              _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:160:13)>
              ::_M_invoke;
  local_c00 = CLI::std::
              _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:160:13)>
              ::_M_manager;
  local_c10._M_unused._0_8_ = (undefined8)variable;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f8,"port number for the local receive port",&local_c14);
  pOVar2 = CLI::App::add_option_function<int>
                     (pAVar4,&local_8d8,(function<void_(const_int_&)> *)&local_c10,&local_8f8);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[3],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_b58,(char (*) [5])0x3880a1,(char (*) [3])0x3a599f);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[5],_true>
            (&local_b18,(char (*) [3])0x3a5f3c,(char (*) [5])"-999");
  values_01._M_len = 2;
  values_01._M_array = (iterator)&local_b58;
  CLI::Transformer::Transformer<std::__cxx11::string(&)(std::__cxx11::string)>
            ((Transformer *)&local_be0,values_01,CLI::ignore_case);
  CLI::Validator::Validator(&local_238,&local_be0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b78,"",&local_c11);
  pOVar2 = CLI::Option::transform(pOVar2,&local_238,&local_b78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,"HELICS_LOCAL_PORT",&local_c12);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pOVar2->envname_,
             &local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_b78);
  CLI::Validator::~Validator(&local_238);
  CLI::Validator::~Validator(&local_be0);
  lVar5 = 0x40;
  do {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&local_b58 + lVar5));
    lVar5 = lVar5 + -0x40;
  } while (lVar5 != -0x40);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_c10);
  std::__cxx11::string::~string((string *)&local_8d8);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_918,"--portstart",(allocator<char> *)local_b58._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_938,"starting port for automatic port definitions",
             (allocator<char> *)&local_be0);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar4,&local_918,(int *)((long)&variable[5]._M_string_length + 4),&local_938);
  std::__cxx11::string::~string((string *)&local_938);
  std::__cxx11::string::~string((string *)&local_918);
  pAVar4 = (App *)(this->brokerName)._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_958,"encryption",(allocator<char> *)local_b58._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_978,"options related to encryption",(allocator<char> *)&local_be0);
  pAVar4 = &CLI::App::add_option_group<CLI::Option_group>(pAVar4,&local_958,&local_978)->super_App;
  std::__cxx11::string::~string((string *)&local_978);
  std::__cxx11::string::~string((string *)&local_958);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_998,"--encrypted",(allocator<char> *)local_b58._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9b8,"enable encryption on the network",(allocator<char> *)&local_be0);
  pOVar2 = CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
                     (pAVar4,&local_998,(bool *)((long)&variable[6]._M_dataplus._M_p + 5),&local_9b8
                     );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"HELICS_ENCRYPTION",(allocator<char> *)local_c10._M_pod_data);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pOVar2->envname_,
             &local_338);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::__cxx11::string::~string((string *)&local_998);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9d8,"--encryption_config",(allocator<char> *)local_b58._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f8,"set the configuration file for encryption options",
             (allocator<char> *)&local_be0);
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_9d8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &variable[6]._M_string_length,&local_9f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"HELICS_ENCRYPTION_CONFIG",
             (allocator<char> *)local_c10._M_pod_data);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pOVar2->envname_,
             &local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_9f8);
  std::__cxx11::string::~string((string *)&local_9d8);
  local_378._8_8_ = 0;
  local_360 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:181:28)>
              ::_M_invoke;
  local_368 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:181:28)>
              ::_M_manager;
  local_378._M_unused._0_8_ = variable;
  helicsCLI11App::add_callback
            ((helicsCLI11App *)(this->brokerName)._M_dataplus._M_p,(function<void_()> *)&local_378);
  std::_Function_base::~_Function_base((_Function_base *)&local_378);
  sVar6.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar6.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar6.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> NetworkBrokerData::commandLineParser(std::string_view localAddress,
                                                                     bool enableConfig)
{
    auto nbparser = std::make_shared<helicsCLI11App>(
        "Network connection information \n(arguments allow '_' characters in the names and ignore them)");
    if (enableConfig) {
        auto* fmtr = addJsonConfig(nbparser.get());
        fmtr->maxLayers(0);
        fmtr->promoteSection("helics");
    }
    nbparser->option_defaults()->ignore_underscore()->ignore_case();

    auto* interfaceFlag = nbparser
                              ->add_flag("--local{0},--ipv4{4},--ipv6{6},--all{10},--external{10}",
                                         interfaceNetwork,
                                         "specify external interface to use, default is --local")
                              ->disable_flag_override();
    nbparser
        ->add_option("--network_connectivity",
                     interfaceNetwork,
                     "specify the connectivity of the network interface")
        ->transform(CLI::CheckedTransformer(
            {{"local", "0"}, {"ipv4", "4"}, {"ipv6", "6"}, {"external", "10"}, {"all", "10"}}))
        ->excludes(interfaceFlag);
    nbparser
        ->add_option_function<std::string>(
            "--broker_address",
            [this, localAddress](const std::string& addr) {
                auto brkprt = gmlc::networking::extractInterfaceAndPort(addr);
                brokerAddress = brkprt.first;
                brokerPort = brkprt.second;
                checkAndUpdateBrokerAddress(localAddress);
            },
            "location of the broker i.e. network address")
        ->envname("HELICS_BROKER_ADDRESS");
    nbparser->add_flag("--reuse_address",
                       reuse_address,
                       "allow the server to reuse a bound address, mostly useful for tcp cores");
    nbparser
        ->add_flag(
            "--noackconnect",
            noAckConnection,
            "specify that a connection_ack message is not required to be connected with a broker")
        ->ignore_underscore();

    nbparser->add_flag(
        "--force",
        forceConnection,
        "if set to true the broker will on an unsuccessful connection as root broker attempt to terminate any existing brokers and reconnect");
    nbparser->add_option_function<std::string>(
        "--broker",
        [this, localAddress](std::string addr) {
            auto brkr = BrokerFactory::findBroker(addr);
            if (brkr) {
                addr = brkr->getAddress();
            }
            if (brokerAddress.empty()) {
                auto brkprt = gmlc::networking::extractInterfaceAndPort(addr);
                brokerAddress = brkprt.first;
                brokerPort = brkprt.second;
                checkAndUpdateBrokerAddress(localAddress);
            } else {
                brokerName = addr;
            }
        },
        "identifier for the broker, this is either the name or network address use --broker_address or --brokername "
        "to explicitly set the network address or name the search for the broker is first by name");

    nbparser->add_option("--brokername", brokerName, "the name of the broker");
    nbparser->add_option("--maxsize", maxMessageSize, "The message buffer size")
        ->capture_default_str()
        ->check(CLI::PositiveNumber);
    nbparser
        ->add_option("--maxcount",
                     maxMessageCount,
                     "The maximum number of message to have in a queue")
        ->capture_default_str()
        ->check(CLI::PositiveNumber);
    nbparser->add_option("--networkretries", maxRetries, "the maximum number of network retries")
        ->capture_default_str();
    nbparser->add_flag("--useosport",
                       use_os_port,
                       "specify that the ports should be allocated by the host operating system");
    nbparser->add_flag("--autobroker",
                       autobroker,
                       "allow a broker to be automatically created if one is not available");
    nbparser->add_option("--brokerinitstring",
                         brokerInitString,
                         "the initialization string for the broker");
    nbparser
        ->add_option("--brokerinit", brokerInitString, "the initialization string for the broker")
        ->envname("HELICS_BROKER_INIT");
    nbparser
        ->add_flag_function(
            "--client{0},--server{1}",
            [this](int64_t val) {
                switch (server_mode) {
                    case ServerModeOptions::UNSPECIFIED:
                    case ServerModeOptions::SERVER_DEFAULT_ACTIVE:
                    case ServerModeOptions::SERVER_DEFAULT_DEACTIVATED:
                        server_mode = (val > 0) ? ServerModeOptions::SERVER_ACTIVE :
                                                  ServerModeOptions::SERVER_DEACTIVATED;
                        break;
                    default:
                        break;
                }
            },
            "specify that the network connection should be a server or client")
        ->disable_flag_override();
    nbparser->add_option_function<std::string>(
        "--local_interface",
        [this](const std::string& addr) {
            auto localprt = gmlc::networking::extractInterfaceAndPort(addr);
            localInterface = localprt.first;
            // this may get overridden later
            portNumber = localprt.second;
        },
        "the local interface to use for the receive ports");
    nbparser->add_option("--port,-p", portNumber, "port number to use")
        ->transform(CLI::Transformer({{"auto", "-1"}}, CLI::ignore_case));
    nbparser
        ->add_option("--brokerport",
                     brokerPort,
                     "the port number to use to connect with the broker")
        ->envname("HELICS_BROKER_PORT");

    nbparser
        ->add_option("--connectionport",
                     connectionPort,
                     "the port number to use to connect a co-simulation")
        ->envname("HELICS_CONNECTION_PORT");
    nbparser
        ->add_option("--connectionaddress",
                     connectionAddress,
                     "the network address to use to connect a co-simulation")
        ->envname("HELICS_CONNECTION_ADDRESS");
    nbparser
        ->add_option_function<int>(
            "--localport",
            [this](int port) {
                if (port == -999) {
                    use_os_port = true;
                } else {
                    portNumber = port;
                }
            },
            "port number for the local receive port")
        ->transform(CLI::Transformer({{"auto", "-1"}, {"os", "-999"}}, CLI::ignore_case))
        ->envname("HELICS_LOCAL_PORT");
    nbparser->add_option("--portstart", portStart, "starting port for automatic port definitions");

    auto* encrypt_group = nbparser->add_option_group("encryption", "options related to encryption");
    encrypt_group->add_flag("--encrypted", encrypted, "enable encryption on the network")
        ->envname("HELICS_ENCRYPTION");
    encrypt_group
        ->add_option("--encryption_config",
                     encryptionConfig,
                     "set the configuration file for encryption options")
        ->envname("HELICS_ENCRYPTION_CONFIG");

    nbparser->add_callback([this]() {
        if ((!brokerAddress.empty()) && (brokerPort == -1)) {
            if ((localInterface.empty()) && (portNumber != -1)) {
                std::swap(brokerPort, portNumber);
            }
        }
    });

    return nbparser;
}